

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::IfcSIUnit(IfcSIUnit *this)

{
  *(undefined ***)&this->field_0x90 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x98 = 0;
  *(char **)&this->field_0xa0 = "IfcSIUnit";
  IfcNamedUnit::IfcNamedUnit(&this->super_IfcNamedUnit,&PTR_construction_vtable_24__008915a0);
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x40 = 0;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x891538;
  *(undefined8 *)&this->field_0x90 = 0x891588;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x891560;
  *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48 = &this->field_0x58;
  *(undefined8 *)&this->field_0x50 = 0;
  this->field_0x58 = 0;
  this->field_0x68 = 0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}